

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O3

void __thiscall
snestistics::AnnotationResolver::add_vector_annotations(AnnotationResolver *this,RomAccessor *rom)

{
  add_vector_comment(this,rom,"Vector: Native COP",0xffe4);
  add_vector_comment(this,rom,"Vector: Native BRK",0xffe6);
  add_vector_comment(this,rom,"Vector: Native ABORT",0xffe8);
  add_vector_comment(this,rom,"Vector: Native NMI",0xffea);
  add_vector_comment(this,rom,"Vector: Native IRQ",0xffee);
  add_vector_comment(this,rom,"Vector: Emulation COP",0xfff4);
  add_vector_comment(this,rom,"Vector: Emulation ABORT",0xfff8);
  add_vector_comment(this,rom,"Vector: Emulation NMI",0xfffa);
  add_vector_comment(this,rom,"Vector: Emulation RESET",0xfffc);
  add_vector_comment(this,rom,"Vector: Emulation IRQBRK",0xfffe);
  return;
}

Assistant:

void AnnotationResolver::add_vector_annotations(const RomAccessor &rom) {
	// "Programming the 65816", page 55
	add_vector_comment(rom, "Vector: Native COP",       0xFFE4);
	add_vector_comment(rom, "Vector: Native BRK",       0xFFE6);
	add_vector_comment(rom, "Vector: Native ABORT",     0xFFE8);
	add_vector_comment(rom, "Vector: Native NMI",       0xFFEA);
	add_vector_comment(rom, "Vector: Native IRQ",       0xFFEE);
	add_vector_comment(rom, "Vector: Emulation COP",    0xFFF4);
	add_vector_comment(rom, "Vector: Emulation ABORT",  0xFFF8);
	add_vector_comment(rom, "Vector: Emulation NMI",    0xFFFA);
	add_vector_comment(rom, "Vector: Emulation RESET",  0xFFFC);
	add_vector_comment(rom, "Vector: Emulation IRQBRK", 0xFFFE);
}